

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O2

int read_file(coda_product *product)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined5 uVar5;
  double dVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  char cVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  char cVar13;
  char cVar14;
  undefined2 uVar15;
  undefined4 uVar16;
  byte value;
  uint uVar17;
  int iVar18;
  int iVar19;
  FILE *__stream;
  long lVar20;
  coda_mem_data *pcVar21;
  coda_type_record_field *pcVar22;
  coda_mem_array **ppcVar23;
  coda_type_array *pcVar24;
  coda_mem_special *pcVar25;
  coda_mem_array *pcVar26;
  coda_mem_record *pcVar27;
  coda_mem_record *type;
  coda_type_record *pcVar28;
  byte value_00;
  undefined4 uVar29;
  ulong uVar30;
  char *pcVar31;
  char *pcVar32;
  ulong uVar33;
  long lVar34;
  satellite_info *psVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ingest_info local_9f0;
  int64_t int_value;
  char acStack_8c0 [3];
  undefined4 uStack_8bd;
  undefined4 uStack_8b9;
  ulong local_8b5;
  undefined1 local_8ad;
  char str_1 [17];
  int local_88c;
  coda_mem_array **local_888;
  int local_880;
  int number;
  double double_value;
  undefined3 uStack_870;
  undefined5 uStack_86d;
  undefined3 uStack_868;
  undefined1 local_85d;
  coda_mem_record *local_830;
  double double_value_1;
  double local_820;
  satellite_info *local_818;
  long local_810;
  char line_1 [1000];
  char line [1000];
  
  local_9f0.header = (coda_mem_record *)0x0;
  local_9f0.gps.num_observables = 0;
  local_9f0.gps.observable = (char **)0x0;
  local_9f0.gps.sat_obs_definition = (coda_type_record *)0x0;
  local_9f0.gps.sat_obs_array_definition = (coda_type_array *)0x0;
  local_9f0.gps.sat_obs_array._0_4_ = 0;
  local_9f0.gps.sat_obs_array._4_4_ = 0;
  local_9f0.gps.records._0_4_ = 0;
  local_9f0.gps.records._4_4_ = 0;
  local_9f0.glonass.num_observables = 0;
  local_9f0.glonass.observable = (char **)0x0;
  local_9f0.glonass.sat_obs_definition = (coda_type_record *)0x0;
  local_9f0.glonass.sat_obs_array_definition = (coda_type_array *)0x0;
  local_9f0.glonass.sat_obs_array._0_4_ = 0;
  local_9f0.glonass.sat_obs_array._4_4_ = 0;
  local_9f0.glonass.records._0_4_ = 0;
  local_9f0.glonass.records._4_4_ = 0;
  local_9f0.galileo.num_observables = 0;
  local_9f0.galileo.observable = (char **)0x0;
  local_9f0.galileo.sat_obs_definition = (coda_type_record *)0x0;
  local_9f0.galileo.sat_obs_array_definition = (coda_type_array *)0x0;
  local_9f0.galileo.sat_obs_array._0_4_ = 0;
  local_9f0.galileo.sat_obs_array._4_4_ = 0;
  local_9f0.galileo.records._0_4_ = 0;
  local_9f0.galileo.records._4_4_ = 0;
  local_9f0.sbas.num_observables = 0;
  local_9f0.sbas.observable = (char **)0x0;
  local_9f0.sbas.sat_obs_definition = (coda_type_record *)0x0;
  local_9f0.sbas.sat_obs_array_definition = (coda_type_array *)0x0;
  local_9f0.sbas.sat_obs_array = (coda_mem_array *)0x0;
  local_9f0.sbas.records = (coda_mem_array *)0x0;
  local_9f0.format_version = 0.0;
  local_9f0.file_type = ' ';
  local_9f0.satellite_system = ' ';
  local_9f0.epoch_record_definition = (coda_type_record *)0x0;
  local_9f0.epoch_record = (coda_mem_record *)0x0;
  local_9f0.sys_array = (coda_mem_array *)0x0;
  local_9f0.records = (coda_mem_array *)0x0;
  local_9f0.ionospheric_corr_array = (coda_mem_array *)0x0;
  local_9f0.time_system_corr_array = (coda_mem_array *)0x0;
  local_9f0.product = product;
  __stream = fopen(product->filename,"r");
  local_9f0.f = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    coda_set_error(-0x15,"could not open file %s",product->filename);
    return -1;
  }
  local_9f0.offset = ftell(__stream);
  local_9f0.linenumber = 1;
  uVar17 = get_line((FILE *)__stream,line);
  if ((int)uVar17 < 0) goto LAB_0014f5f7;
  if (uVar17 < 0x3d) {
    pcVar31 = (char *)(long)(int)uVar17;
    goto LAB_0014f57f;
  }
  pcVar31 = line + 0x3c;
  iVar18 = bcmp(pcVar31,"RINEX VERSION / TYPE",0x14);
  if (iVar18 == 0) {
    lVar20 = coda_ascii_parse_double(line,9,&local_9f0.format_version,0);
    lVar34 = local_9f0.offset;
    if (lVar20 < 0) {
LAB_00151529:
      coda_add_error_message(" (line: %ld, byte offset: %ld)",local_9f0.linenumber,lVar34);
      goto LAB_0014f5f7;
    }
    local_9f0.file_type = line[0x14];
    if (line[0x14] == 'C') {
      lVar34 = 0x470;
      if (((local_9f0.format_version == 2.0) && (!NAN(local_9f0.format_version))) ||
         ((local_9f0.format_version == 3.0 && (!NAN(local_9f0.format_version))))) {
LAB_0014f6fe:
        lVar20 = __tls_get_addr(&PTR_001d8d10);
        plVar1 = (long *)(lVar20 + 0x1118);
        local_9f0.header =
             coda_mem_record_new(*(coda_type_record **)(*plVar1 + lVar34),(coda_dynamic_type *)0x0);
        uVar29 = line._40_4_;
        if (local_9f0.format_version != 3.0) {
          uVar29._0_1_ = 'G';
          uVar29._1_1_ = '\0';
          uVar29._2_1_ = '\0';
          uVar29._3_1_ = '\0';
        }
        local_9f0.satellite_system = (char)uVar29;
        if (NAN(local_9f0.format_version)) {
          local_9f0.satellite_system = 'G';
        }
        pcVar21 = coda_mem_float_new(*(coda_type_number **)*plVar1,(coda_dynamic_type *)0x0,
                                     local_9f0.product,(float)local_9f0.format_version);
        coda_mem_record_add_field(local_9f0.header,"format_version",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_char_new(*(coda_type_text **)(*plVar1 + 8),(coda_dynamic_type *)0x0,
                                    local_9f0.product,local_9f0.file_type);
        coda_mem_record_add_field(local_9f0.header,"file_type",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_char_new(*(coda_type_text **)(*plVar1 + 0x10),(coda_dynamic_type *)0x0,
                                    local_9f0.product,local_9f0.satellite_system);
        coda_mem_record_add_field
                  (local_9f0.header,"satellite_system",(coda_dynamic_type *)pcVar21,0);
        if (local_9f0.file_type == 'N') {
          local_9f0.epoch_record_definition = coda_type_record_new(coda_format_rinex);
          pcVar22 = coda_type_record_field_new("epoch");
          coda_type_record_field_set_type(pcVar22,*(coda_type **)(*plVar1 + 0x168));
          coda_type_record_add_field(local_9f0.epoch_record_definition,pcVar22);
          pcVar22 = coda_type_record_field_new("flag");
          coda_type_record_field_set_type(pcVar22,*(coda_type **)(*plVar1 + 0x170));
          coda_type_record_add_field(local_9f0.epoch_record_definition,pcVar22);
          pcVar22 = coda_type_record_field_new("receiver_clock_offset");
          coda_type_record_field_set_type(pcVar22,*(coda_type **)(*plVar1 + 0x178));
          coda_type_record_add_field(local_9f0.epoch_record_definition,pcVar22);
          local_9f0.ionospheric_corr_array =
               coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x1d0),(coda_dynamic_type *)0x0);
          local_9f0.time_system_corr_array =
               coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x218),(coda_dynamic_type *)0x0);
          local_9f0.offset = ftell((FILE *)local_9f0.f);
          local_9f0.linenumber = local_9f0.linenumber + 1;
          uVar17 = get_line(local_9f0.f,line);
          while (-1 < (int)uVar17) {
            if (uVar17 == 0) {
LAB_00151556:
              coda_mem_record_add_field
                        (local_9f0.header,"ionospheric_corr",
                         (coda_dynamic_type *)local_9f0.ionospheric_corr_array,0);
              local_9f0.ionospheric_corr_array = (coda_mem_array *)0x0;
              coda_mem_record_add_field
                        (local_9f0.header,"time_system_corr",
                         (coda_dynamic_type *)local_9f0.time_system_corr_array,0);
              local_9f0.time_system_corr_array = (coda_mem_array *)0x0;
              local_9f0.offset = ftell((FILE *)local_9f0.f);
              local_9f0.linenumber = local_9f0.linenumber + 1;
              iVar18 = coda_mem_record_validate(local_9f0.header);
              if (iVar18 == 0) {
                pcVar26 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x400),
                                             (coda_dynamic_type *)0x0);
                local_9f0.gps.records._0_4_ = SUB84(pcVar26,0);
                local_9f0.gps.records._4_4_ = (undefined4)((ulong)pcVar26 >> 0x20);
                pcVar26 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x408),
                                             (coda_dynamic_type *)0x0);
                local_9f0.glonass.records._0_4_ = SUB84(pcVar26,0);
                local_9f0.glonass.records._4_4_ = (undefined4)((ulong)pcVar26 >> 0x20);
                pcVar26 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x410),
                                             (coda_dynamic_type *)0x0);
                local_9f0.galileo.records._0_4_ = SUB84(pcVar26,0);
                local_9f0.galileo.records._4_4_ = (undefined4)((ulong)pcVar26 >> 0x20);
                local_9f0.sbas.records =
                     coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x418),
                                        (coda_dynamic_type *)0x0);
                local_9f0.offset = ftell((FILE *)local_9f0.f);
                local_9f0.linenumber = local_9f0.linenumber + 1;
                uVar17 = get_line(local_9f0.f,line);
                if (-1 < (int)uVar17) {
                  local_888 = &local_9f0.sbas.records;
                  goto LAB_00151680;
                }
              }
              break;
            }
            if (uVar17 < 0x3d) goto LAB_00151500;
            iVar18 = bcmp(pcVar31,"PGM / RUN BY / DATE",0x13);
            if (iVar18 == 0) {
              line_1._16_2_ = (undefined2)line._16_4_;
              line_1._18_2_ = SUB42(line._16_4_,2);
              line_1._8_2_ = (undefined2)line._8_4_;
              line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
              line_1._13_2_ = SUB42(line._12_4_,1);
              line_1[0xf] = SUB41(line._12_4_,3);
              line_1._20_4_ = line_1._20_4_ & 0xffffff00;
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x18),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              coda_mem_record_add_field(local_9f0.header,"program",(coda_dynamic_type *)pcVar21,0);
              line_1[1] = (char)line._21_2_;
              line_1[2] = SUB21(line._21_2_,1);
              line_1[3] = (char)line._23_4_;
              line_1[4] = SUB41(line._23_4_,1);
              line_1[5] = SUB41(line._23_4_,2);
              line_1[6] = SUB41(line._23_4_,3);
              line_1._8_2_ = (undefined2)line._28_4_;
              line_1._10_3_ = (undefined3)(CONCAT24(line._32_2_,line._28_4_) >> 0x10);
              line_1._13_2_ =
                   (undefined2)(CONCAT16(line[0x22],CONCAT24(line._32_2_,line._28_4_)) >> 0x28);
              line_1._16_2_ = (undefined2)line._36_4_;
              line_1._18_2_ = SUB42(line._36_4_,2);
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x20),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              coda_mem_record_add_field(local_9f0.header,"run_by",(coda_dynamic_type *)pcVar21,0);
              line_1[0] = (char)line._40_4_;
              line_1[1] = SUB41(line._40_4_,1);
              line_1[2] = SUB41(line._40_4_,2);
              line_1[3] = SUB41(line._40_4_,3);
              line_1[4] = (char)line._44_4_;
              line_1[5] = SUB41(line._44_4_,1);
              line_1[6] = SUB41(line._44_4_,2);
              line_1[7] = line[0x2f];
              line_1[8] = line[0x30];
              line_1[9] = line[0x31];
              line_1._10_3_ = (undefined3)CONCAT41(line._51_4_,line[0x32]);
              line_1._13_2_ = SUB42(line._51_4_,2);
              line_1[0xf] = '\0';
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x30),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x28),
                                          (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
              coda_mem_record_add_field(local_9f0.header,"datetime",(coda_dynamic_type *)pcVar25,0);
              line_1[0] = (char)line._56_2_;
              line_1[1] = SUB21(line._56_2_,1);
              line_1[2] = line[0x3a];
              line_1[3] = '\0';
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x38),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar32 = "datetime_time_zone";
LAB_00150c35:
              coda_mem_record_add_field(local_9f0.header,pcVar32,(coda_dynamic_type *)pcVar21,0);
            }
            else {
              iVar18 = bcmp(pcVar31,"COMMENT",7);
              if (iVar18 != 0) {
                auVar37[0] = -(line[0x3c] == 'I');
                auVar37[1] = -(line[0x3d] == 'O');
                auVar37[2] = -(line[0x3e] == 'N');
                auVar37[3] = -(line[0x3f] == 'O');
                auVar37[4] = -(line[0x40] == 'S');
                auVar37[5] = -(line[0x41] == 'P');
                auVar37[6] = -(line[0x42] == 'H');
                auVar37[7] = -(line[0x43] == 'E');
                auVar37[8] = -(line[0x44] == 'R');
                auVar37[9] = -(line[0x45] == 'I');
                auVar37[10] = -(line[0x46] == 'C');
                auVar37[0xb] = -(line[0x47] == ' ');
                auVar37[0xc] = -(line[0x48] == 'C');
                auVar37[0xd] = -(line[0x49] == 'O');
                auVar37[0xe] = -(line[0x4a] == 'R');
                auVar37[0xf] = -(line[0x4b] == 'R');
                if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar37[0xf] >> 7) << 0xf) == 0xffff) {
                  pcVar27 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x1c8),
                                                (coda_dynamic_type *)0x0);
                  line_1[0] = line[0];
                  line_1[1] = line[1];
                  line_1[2] = line[2];
                  line_1[3] = line[3];
                  line_1[4] = '\0';
                  rtrim(line_1);
                  pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x1b0),
                                                (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                  coda_mem_record_add_field(pcVar27,"type",(coda_dynamic_type *)pcVar21,0);
                  pcVar26 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x1c0),
                                               (coda_dynamic_type *)0x0);
                  pcVar32 = line + 5;
                  for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
                    lVar20 = coda_ascii_parse_double(pcVar32,0xc,&double_value,0);
                    if (lVar20 < 0) {
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar26);
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                      lVar34 = local_9f0.offset;
                      goto LAB_00151529;
                    }
                    pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x1b8),
                                                  (coda_dynamic_type *)0x0,local_9f0.product,
                                                  double_value);
                    coda_mem_array_set_element(pcVar26,lVar34,(coda_dynamic_type *)pcVar21);
                    pcVar32 = pcVar32 + 0xc;
                  }
                  coda_mem_record_add_field(pcVar27,"parameter",(coda_dynamic_type *)pcVar26,0);
                  coda_mem_array_add_element
                            (local_9f0.ionospheric_corr_array,(coda_dynamic_type *)pcVar27);
                }
                else {
                  auVar38[0] = -(line[0x3c] == 'T');
                  auVar38[1] = -(line[0x3d] == 'I');
                  auVar38[2] = -(line[0x3e] == 'M');
                  auVar38[3] = -(line[0x3f] == 'E');
                  auVar38[4] = -(line[0x40] == ' ');
                  auVar38[5] = -(line[0x41] == 'S');
                  auVar38[6] = -(line[0x42] == 'Y');
                  auVar38[7] = -(line[0x43] == 'S');
                  auVar38[8] = -(line[0x44] == 'T');
                  auVar38[9] = -(line[0x45] == 'E');
                  auVar38[10] = -(line[0x46] == 'M');
                  auVar38[0xb] = -(line[0x47] == ' ');
                  auVar38[0xc] = -(line[0x48] == 'C');
                  auVar38[0xd] = -(line[0x49] == 'O');
                  auVar38[0xe] = -(line[0x4a] == 'R');
                  auVar38[0xf] = -(line[0x4b] == 'R');
                  if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar38[0xf] >> 7) << 0xf) != 0xffff) {
                    iVar18 = bcmp(pcVar31,"LEAP SECONDS",0xc);
                    if (iVar18 == 0) {
                      lVar20 = coda_ascii_parse_int64(line,6,&int_value,0);
                      lVar34 = local_9f0.offset;
                      if (-1 < lVar20) {
                        pcVar21 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x148),
                                                     (coda_dynamic_type *)0x0,local_9f0.product,
                                                     (int32_t)int_value);
                        pcVar32 = "leap_seconds";
                        goto LAB_00150c35;
                      }
                      goto LAB_00151529;
                    }
                    iVar18 = bcmp(pcVar31,"END OF HEADER",0xd);
                    if (iVar18 == 0) goto LAB_00151556;
                    goto LAB_0014f5cf;
                  }
                  pcVar27 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x210),
                                                (coda_dynamic_type *)0x0);
                  line_1[0] = line[0];
                  line_1[1] = line[1];
                  line_1[2] = line[2];
                  line_1[3] = line[3];
                  line_1[4] = '\0';
                  rtrim(line_1);
                  pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x1d8),
                                                (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                  coda_mem_record_add_field(pcVar27,"type",(coda_dynamic_type *)pcVar21,0);
                  bVar2 = line_1[1] == 'B';
                  bVar3 = line_1[0] == 'S';
                  lVar34 = coda_ascii_parse_double(line + 5,0x11,&double_value,0);
                  if (lVar34 < 0) {
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                    lVar34 = local_9f0.offset + 5;
                    goto LAB_00151529;
                  }
                  pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x1e0),
                                                (coda_dynamic_type *)0x0,local_9f0.product,
                                                double_value);
                  coda_mem_record_add_field(pcVar27,"a0",(coda_dynamic_type *)pcVar21,0);
                  lVar34 = coda_ascii_parse_double(line + 0x16,0x10,&double_value,0);
                  if (lVar34 < 0) {
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                    lVar34 = local_9f0.offset + 0x16;
                    goto LAB_00151529;
                  }
                  pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x1e8),
                                                (coda_dynamic_type *)0x0,local_9f0.product,
                                                double_value);
                  coda_mem_record_add_field(pcVar27,"a1",(coda_dynamic_type *)pcVar21,0);
                  lVar34 = coda_ascii_parse_int64(line + 0x26,7,&int_value,0);
                  if (lVar34 < 0) {
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                    lVar34 = local_9f0.offset + 0x26;
                    goto LAB_00151529;
                  }
                  pcVar21 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x1f0),
                                               (coda_dynamic_type *)0x0,local_9f0.product,
                                               (int32_t)int_value);
                  coda_mem_record_add_field(pcVar27,"T",(coda_dynamic_type *)pcVar21,0);
                  lVar34 = coda_ascii_parse_int64(line + 0x2d,5,&int_value,0);
                  if (lVar34 < 0) {
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                    lVar34 = local_9f0.offset + 0x2d;
                    goto LAB_00151529;
                  }
                  pcVar21 = coda_mem_int16_new(*(coda_type_number **)(*plVar1 + 0x1f8),
                                               (coda_dynamic_type *)0x0,local_9f0.product,
                                               (uint16_t)int_value);
                  coda_mem_record_add_field(pcVar27,"W",(coda_dynamic_type *)pcVar21,0);
                  if (bVar2 && bVar3) {
                    line_1[4] = line[0x37];
                    line_1[0] = (char)line._51_4_;
                    line_1[1] = SUB41(line._51_4_,1);
                    line_1[2] = SUB41(line._51_4_,2);
                    line_1[3] = SUB41(line._51_4_,3);
                    line_1[5] = '\0';
                    rtrim(line_1);
                    pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x200),
                                                  (coda_dynamic_type *)0x0,local_9f0.product,line_1)
                    ;
                    coda_mem_record_add_field(pcVar27,"S",(coda_dynamic_type *)pcVar21,0);
                    lVar34 = coda_ascii_parse_int64(line + 0x39,2,&int_value,0);
                    if (lVar34 < 0) {
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                      lVar34 = local_9f0.offset + 0x39;
                      goto LAB_00151529;
                    }
                    pcVar21 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x208),
                                                 (coda_dynamic_type *)0x0,local_9f0.product,
                                                 (uint8_t)int_value);
                    coda_mem_record_add_field(pcVar27,"U",(coda_dynamic_type *)pcVar21,0);
                  }
                  coda_mem_array_add_element
                            (local_9f0.time_system_corr_array,(coda_dynamic_type *)pcVar27);
                }
              }
            }
            local_9f0.offset = ftell((FILE *)local_9f0.f);
            local_9f0.linenumber = local_9f0.linenumber + 1;
            uVar17 = get_line(local_9f0.f,line);
          }
        }
        else if (local_9f0.file_type == 'O') {
          local_9f0.epoch_record_definition = coda_type_record_new(coda_format_rinex);
          pcVar22 = coda_type_record_field_new("epoch");
          coda_type_record_field_set_type(pcVar22,*(coda_type **)(*plVar1 + 0x168));
          coda_type_record_add_field(local_9f0.epoch_record_definition,pcVar22);
          pcVar22 = coda_type_record_field_new("flag");
          coda_type_record_field_set_type(pcVar22,*(coda_type **)(*plVar1 + 0x170));
          coda_type_record_add_field(local_9f0.epoch_record_definition,pcVar22);
          pcVar22 = coda_type_record_field_new("receiver_clock_offset");
          coda_type_record_field_set_type(pcVar22,*(coda_type **)(*plVar1 + 0x178));
          coda_type_record_add_field(local_9f0.epoch_record_definition,pcVar22);
          local_9f0.sys_array =
               coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x100),(coda_dynamic_type *)0x0);
          local_9f0.offset = ftell((FILE *)local_9f0.f);
          local_9f0.linenumber = local_9f0.linenumber + 1;
          uVar17 = get_line(local_9f0.f,line);
          while (-1 < (int)uVar17) {
            pcVar31 = line + 0x3c;
            if (uVar17 == 0) {
LAB_001532cf:
              coda_mem_record_add_field
                        (local_9f0.header,"sys",(coda_dynamic_type *)local_9f0.sys_array,0);
              local_9f0.sys_array = (coda_mem_array *)0x0;
              local_9f0.offset = ftell((FILE *)local_9f0.f);
              local_9f0.linenumber = local_9f0.linenumber + 1;
              iVar18 = coda_mem_record_validate(local_9f0.header);
              if (iVar18 == 0) {
                pcVar24 = coda_type_array_new(coda_format_rinex);
                coda_type_array_add_variable_dimension(pcVar24,(coda_expression *)0x0);
                coda_type_array_set_base_type
                          (pcVar24,(coda_type *)local_9f0.epoch_record_definition);
                local_9f0.records = coda_mem_array_new(pcVar24,(coda_dynamic_type *)0x0);
                coda_type_release((coda_type *)pcVar24);
                local_9f0.offset = ftell((FILE *)local_9f0.f);
                local_9f0.linenumber = local_9f0.linenumber + 1;
                uVar17 = get_line(local_9f0.f,line_1);
                if (-1 < (int)uVar17) {
                  local_888 = &local_9f0.records;
                  goto LAB_001533ac;
                }
              }
              break;
            }
            if (uVar17 < 0x3d) goto LAB_00151500;
            iVar18 = bcmp(pcVar31,"PGM / RUN BY / DATE",0x13);
            if (iVar18 == 0) {
              line_1._16_2_ = (undefined2)line._16_4_;
              line_1._18_2_ = SUB42(line._16_4_,2);
              line_1._8_2_ = (undefined2)line._8_4_;
              line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
              line_1._13_2_ = SUB42(line._12_4_,1);
              line_1[0xf] = SUB41(line._12_4_,3);
              line_1._20_4_ = line_1._20_4_ & 0xffffff00;
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x18),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              coda_mem_record_add_field(local_9f0.header,"program",(coda_dynamic_type *)pcVar21,0);
              line_1[1] = (char)line._21_2_;
              line_1[2] = SUB21(line._21_2_,1);
              line_1[3] = (char)line._23_4_;
              line_1[4] = SUB41(line._23_4_,1);
              line_1[5] = SUB41(line._23_4_,2);
              line_1[6] = SUB41(line._23_4_,3);
              line_1._8_2_ = (undefined2)line._28_4_;
              line_1._10_3_ = (undefined3)(CONCAT24(line._32_2_,line._28_4_) >> 0x10);
              line_1._13_2_ =
                   (undefined2)(CONCAT16(line[0x22],CONCAT24(line._32_2_,line._28_4_)) >> 0x28);
              line_1._16_2_ = (undefined2)line._36_4_;
              line_1._18_2_ = SUB42(line._36_4_,2);
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x20),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              coda_mem_record_add_field(local_9f0.header,"run_by",(coda_dynamic_type *)pcVar21,0);
              line_1[0] = (char)line._40_4_;
              line_1[1] = SUB41(line._40_4_,1);
              line_1[2] = SUB41(line._40_4_,2);
              line_1[3] = SUB41(line._40_4_,3);
              line_1[4] = (char)line._44_4_;
              line_1[5] = SUB41(line._44_4_,1);
              line_1[6] = SUB41(line._44_4_,2);
              line_1[7] = line[0x2f];
              line_1[8] = line[0x30];
              line_1[9] = line[0x31];
              line_1._10_3_ = (undefined3)CONCAT41(line._51_4_,line[0x32]);
              line_1._13_2_ = SUB42(line._51_4_,2);
              line_1[0xf] = '\0';
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x30),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x28),
                                          (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
              coda_mem_record_add_field(local_9f0.header,"datetime",(coda_dynamic_type *)pcVar25,0);
              line_1[0] = (char)line._56_2_;
              line_1[1] = SUB21(line._56_2_,1);
              line_1[2] = line[0x3a];
              line_1[3] = '\0';
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x38),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar31 = "datetime_time_zone";
              goto LAB_001501dc;
            }
            iVar18 = bcmp(pcVar31,"COMMENT",7);
            if (iVar18 == 0) goto LAB_001501e6;
            iVar18 = bcmp(pcVar31,"MARKER NAME",0xb);
            uVar16 = line._51_4_;
            uVar29 = line._23_4_;
            if (iVar18 == 0) {
              line_1[0x37] = line[0x37];
              line_1[0x34] = line[0x34];
              line_1[0x35] = line[0x35];
              line_1[0x36] = line[0x36];
              line_1._48_4_ =
                   (undefined4)
                   (CONCAT17(line[0x33],CONCAT16(line[0x32],CONCAT24(line._48_2_,line._44_4_))) >>
                   0x20);
              line_1._56_4_ =
                   (undefined4)
                   (CONCAT17(line[0x3b],CONCAT16(line[0x3a],CONCAT24(line._56_2_,line_1._52_4_))) >>
                   0x20);
              line_1[0x20] = line[0x20];
              line_1[0x21] = line[0x21];
              line_1[0x22] = line[0x22];
              line_1[0x28] = (char)line._40_4_;
              line_1._41_2_ = SUB42(line._40_4_,1);
              line_1[0x2b] = SUB41(line._40_4_,3);
              line_1._16_2_ = (undefined2)line._16_4_;
              line_1._18_2_ = SUB42(line._16_4_,2);
              line_1._20_4_ =
                   (undefined4)
                   (CONCAT17(line[0x17],CONCAT25(line._21_2_,CONCAT14(line[0x14],line._16_4_))) >>
                   0x20);
              line_1[0x18] = line[0x18];
              line_1[0x19] = line[0x19];
              line_1[0x1a] = line[0x1a];
              line_1._27_2_ =
                   (undefined2)(CONCAT44(line._28_4_,CONCAT13(line[0x1b],line._24_3_)) >> 0x18);
              line_1._29_2_ = SUB42(line._28_4_,1);
              line_1[0x1f] = SUB41(line._28_4_,3);
              line_1[0] = line[0];
              line_1[1] = line[1];
              line_1[2] = line[2];
              line_1[3] = line[3];
              line_1[4] = line[4];
              line_1[5] = line[5];
              line_1[6] = line[6];
              line_1[7] = line[7];
              line_1._8_2_ = (undefined2)line._8_4_;
              line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
              line_1._13_2_ = SUB42(line._12_4_,1);
              line_1[0xf] = SUB41(line._12_4_,3);
              line_1._60_4_ = line_1._60_4_ & 0xffffff00;
              line._23_4_ = uVar29;
              line._51_4_ = uVar16;
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x40),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar31 = "marker_name";
LAB_001501dc:
              coda_mem_record_add_field(local_9f0.header,pcVar31,(coda_dynamic_type *)pcVar21,0);
            }
            else {
              iVar18 = bcmp(pcVar31,"MARKER NUMBER",0xd);
              if (iVar18 == 0) {
                line_1._16_2_ = (undefined2)line._16_4_;
                line_1._18_2_ = SUB42(line._16_4_,2);
                line_1[0] = line[0];
                line_1[1] = line[1];
                line_1[2] = line[2];
                line_1[3] = line[3];
                line_1[4] = line[4];
                line_1[5] = line[5];
                line_1[6] = line[6];
                line_1[7] = line[7];
                line_1._8_2_ = (undefined2)line._8_4_;
                line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                line_1._13_2_ = SUB42(line._12_4_,1);
                line_1[0xf] = SUB41(line._12_4_,3);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x48),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                pcVar31 = "marker_number";
                goto LAB_001501dc;
              }
              iVar18 = bcmp(pcVar31,"MARKER TYPE",10);
              if (iVar18 == 0) {
                line_1._16_2_ = (undefined2)line._16_4_;
                line_1._18_2_ = SUB42(line._16_4_,2);
                line_1[0] = line[0];
                line_1[1] = line[1];
                line_1[2] = line[2];
                line_1[3] = line[3];
                line_1[4] = line[4];
                line_1[5] = line[5];
                line_1[6] = line[6];
                line_1[7] = line[7];
                line_1._8_2_ = (undefined2)line._8_4_;
                line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                line_1._13_2_ = SUB42(line._12_4_,1);
                line_1[0xf] = SUB41(line._12_4_,3);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x50),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                pcVar31 = "marker_type";
                goto LAB_001501dc;
              }
              iVar18 = bcmp(pcVar31,"OBSERVER / AGENCY",0x11);
              if (iVar18 == 0) {
                line_1._16_2_ = (undefined2)line._16_4_;
                line_1._18_2_ = SUB42(line._16_4_,2);
                line_1._8_2_ = (undefined2)line._8_4_;
                line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                line_1._13_2_ = SUB42(line._12_4_,1);
                line_1[0xf] = SUB41(line._12_4_,3);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x58),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                coda_mem_record_add_field
                          (local_9f0.header,"observer",(coda_dynamic_type *)pcVar21,0);
                line_1[0] = line[0x14];
                line_1[1] = (char)line._21_2_;
                line_1[2] = SUB21(line._21_2_,1);
                line_1[3] = (char)line._23_4_;
                line_1[4] = SUB41(line._23_4_,1);
                line_1[5] = SUB41(line._23_4_,2);
                line_1[6] = SUB41(line._23_4_,3);
                line_1[7] = line[0x1b];
                line_1._8_2_ = (undefined2)line._28_4_;
                line_1._10_3_ = (undefined3)(CONCAT24(line._32_2_,line._28_4_) >> 0x10);
                line_1._13_2_ =
                     (undefined2)(CONCAT16(line[0x22],CONCAT24(line._32_2_,line._28_4_)) >> 0x28);
                line_1[0xf] = line[0x23];
                line_1._16_2_ = (undefined2)line._36_4_;
                line_1._18_2_ = SUB42(line._36_4_,2);
                line_1[0x14] = line[0x28];
                line_1[0x15] = line[0x29];
                line_1[0x16] = line[0x2a];
                line_1[0x17] = line[0x2b];
                line_1._24_3_ = (undefined3)line._44_4_;
                line_1._27_2_ = (undefined2)(CONCAT24(line._48_2_,line._44_4_) >> 0x18);
                line_1._29_2_ =
                     (undefined2)(CONCAT16(line[0x32],CONCAT24(line._48_2_,line._44_4_)) >> 0x28);
                line_1[0x1f] = line[0x33];
                line_1._32_2_ = SUB42(line._51_4_,1);
                line_1[0x22] = SUB41(line._51_4_,3);
                line_1[0x28] = '\0';
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x60),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                pcVar31 = "agency";
                goto LAB_001501dc;
              }
              iVar18 = bcmp(pcVar31,"REC # / TYPE / VERS",0x13);
              if (iVar18 == 0) {
                line_1._16_2_ = (undefined2)line._16_4_;
                line_1._18_2_ = SUB42(line._16_4_,2);
                line_1._8_2_ = (undefined2)line._8_4_;
                line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                line_1._13_2_ = SUB42(line._12_4_,1);
                line_1[0xf] = SUB41(line._12_4_,3);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x68),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                coda_mem_record_add_field
                          (local_9f0.header,"receiver_number",(coda_dynamic_type *)pcVar21,0);
                line_1[1] = (char)line._21_2_;
                line_1[2] = SUB21(line._21_2_,1);
                line_1[3] = (char)line._23_4_;
                line_1[4] = SUB41(line._23_4_,1);
                line_1[5] = SUB41(line._23_4_,2);
                line_1[6] = SUB41(line._23_4_,3);
                line_1._8_2_ = (undefined2)line._28_4_;
                line_1._10_3_ = (undefined3)(CONCAT24(line._32_2_,line._28_4_) >> 0x10);
                line_1._13_2_ =
                     (undefined2)(CONCAT16(line[0x22],CONCAT24(line._32_2_,line._28_4_)) >> 0x28);
                line_1._16_2_ = (undefined2)line._36_4_;
                line_1._18_2_ = SUB42(line._36_4_,2);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x70),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                coda_mem_record_add_field
                          (local_9f0.header,"receiver_type",(coda_dynamic_type *)pcVar21,0);
                line_1[0] = (char)line._40_4_;
                line_1[1] = SUB41(line._40_4_,1);
                line_1[2] = SUB41(line._40_4_,2);
                line_1[3] = SUB41(line._40_4_,3);
                line_1[4] = (char)line._44_4_;
                line_1[5] = SUB41(line._44_4_,1);
                line_1[6] = SUB41(line._44_4_,2);
                line_1[7] = SUB41(line._44_4_,3);
                line_1[8] = line[0x30];
                line_1[9] = line[0x31];
                line_1._10_3_ =
                     (undefined3)(CONCAT43(line._51_4_,CONCAT12(line[0x32],line._48_2_)) >> 0x10);
                line_1._13_2_ = SUB42(line._51_4_,2);
                line_1[0xf] = line[0x37];
                line_1[0x10] = line[0x38];
                line_1[0x11] = line[0x39];
                line_1._18_2_ =
                     (undefined2)(CONCAT13(line[0x3b],CONCAT12(line[0x3a],line._56_2_)) >> 0x10);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x78),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                pcVar31 = "receiver_version";
                goto LAB_001501dc;
              }
              iVar18 = bcmp(pcVar31,"ANT # / TYPE",10);
              if (iVar18 == 0) {
                line_1._16_2_ = (undefined2)line._16_4_;
                line_1._18_2_ = SUB42(line._16_4_,2);
                line_1._8_2_ = (undefined2)line._8_4_;
                line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                line_1._13_2_ = SUB42(line._12_4_,1);
                line_1[0xf] = SUB41(line._12_4_,3);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x80),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                coda_mem_record_add_field
                          (local_9f0.header,"antenna_number",(coda_dynamic_type *)pcVar21,0);
                line_1[0] = line[0x14];
                line_1[1] = (char)line._21_2_;
                line_1[2] = SUB21(line._21_2_,1);
                line_1[3] = (char)line._23_4_;
                line_1[4] = SUB41(line._23_4_,1);
                line_1[5] = SUB41(line._23_4_,2);
                line_1[6] = SUB41(line._23_4_,3);
                line_1[7] = line[0x1b];
                line_1._8_2_ = (undefined2)line._28_4_;
                line_1._10_3_ = (undefined3)(CONCAT24(line._32_2_,line._28_4_) >> 0x10);
                line_1._13_2_ =
                     (undefined2)(CONCAT16(line[0x22],CONCAT24(line._32_2_,line._28_4_)) >> 0x28);
                line_1[0xf] = line[0x23];
                line_1._16_2_ = (undefined2)line._36_4_;
                line_1._18_2_ = SUB42(line._36_4_,2);
                line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                rtrim(line_1);
                pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x88),
                                              (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                pcVar31 = "antenna_type";
                goto LAB_001501dc;
              }
              iVar18 = bcmp(pcVar31,"APPROX POSITION XYZ",0x13);
              if (iVar18 == 0) {
                lVar20 = coda_ascii_parse_double(line,0xe,&double_value,0);
                lVar34 = local_9f0.offset;
                if (lVar20 < 0) goto LAB_00151529;
                pcVar21 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0x90),
                                             (coda_dynamic_type *)0x0,local_9f0.product,
                                             (float)double_value);
                coda_mem_record_add_field
                          (local_9f0.header,"approx_position_x",(coda_dynamic_type *)pcVar21,0);
                lVar34 = coda_ascii_parse_double(line + 0xe,0xe,&double_value,0);
                if (lVar34 < 0) {
LAB_00152be9:
                  lVar34 = local_9f0.offset + 0xe;
                  goto LAB_00151529;
                }
                pcVar21 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0x98),
                                             (coda_dynamic_type *)0x0,local_9f0.product,
                                             (float)double_value);
                coda_mem_record_add_field
                          (local_9f0.header,"approx_position_y",(coda_dynamic_type *)pcVar21,0);
                lVar34 = coda_ascii_parse_double(line + 0x1c,0xe,&double_value,0);
                if (lVar34 < 0) {
LAB_00152c02:
                  lVar34 = local_9f0.offset + 0x1c;
                  goto LAB_00151529;
                }
                pcVar21 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xa0),
                                             (coda_dynamic_type *)0x0,local_9f0.product,
                                             (float)double_value);
                pcVar31 = "approx_position_z";
LAB_0015042c:
                coda_mem_record_add_field(local_9f0.header,pcVar31,(coda_dynamic_type *)pcVar21,0);
              }
              else {
                iVar18 = bcmp(pcVar31,"ANTENNA: DELTA H/E/N",0x14);
                if (iVar18 == 0) {
                  lVar34 = coda_ascii_parse_double(line,0xe,&double_value,0);
                  if (-1 < lVar34) {
                    pcVar21 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xa8),
                                                 (coda_dynamic_type *)0x0,local_9f0.product,
                                                 (float)double_value);
                    coda_mem_record_add_field
                              (local_9f0.header,"antenna_delta_h",(coda_dynamic_type *)pcVar21,0);
                    lVar34 = coda_ascii_parse_double(line + 0xe,0xe,&double_value,0);
                    if (lVar34 < 0) goto LAB_00152be9;
                    pcVar21 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xb0),
                                                 (coda_dynamic_type *)0x0,local_9f0.product,
                                                 (float)double_value);
                    coda_mem_record_add_field
                              (local_9f0.header,"antenna_delta_e",(coda_dynamic_type *)pcVar21,0);
                    lVar34 = coda_ascii_parse_double(line + 0x1c,0xe,&double_value,0);
                    if (lVar34 < 0) goto LAB_00152c02;
                    pcVar21 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xb8),
                                                 (coda_dynamic_type *)0x0,local_9f0.product,
                                                 (float)double_value);
                    pcVar31 = "antenna_delta_n";
                    goto LAB_0015042c;
                  }
                  coda_add_error_message
                            (" (line: %ld, byte offset: %ld)",local_9f0.linenumber,local_9f0.product
                             ,local_9f0.offset);
                  break;
                }
                iVar18 = bcmp(pcVar31,"ANTENNA: DELTA X/Y/Z",0x14);
                if (((iVar18 != 0) &&
                    (iVar18 = bcmp(pcVar31,"ANTENNA: PHASECENTER",0x14), iVar18 != 0)) &&
                   ((iVar18 = bcmp(pcVar31,"ANTENNA: B.SIGHT XYZ",0x14), iVar18 != 0 &&
                    (((iVar18 = bcmp(pcVar31,"ANTENNA: ZERODIR AZI",0x14), iVar18 != 0 &&
                      (iVar18 = bcmp(pcVar31,"ANTENNA: ZERODIR XYZ",0x14), iVar18 != 0)) &&
                     (iVar18 = bcmp(pcVar31,"CENTER OF MASS: XYZ",0x13), iVar18 != 0)))))) {
                  iVar18 = bcmp(pcVar31,"SYS / # / OBS TYPES",0x13);
                  if (iVar18 == 0) {
                    iVar18 = handle_observation_definition(&local_9f0,line);
                    if (iVar18 != 0) break;
                  }
                  else {
                    iVar18 = bcmp(line + 0x3c,"SIGNAL STRENGTH UNIT",0x14);
                    if (iVar18 == 0) {
                      line_1._16_2_ = (undefined2)line._16_4_;
                      line_1._18_2_ = SUB42(line._16_4_,2);
                      line_1[0] = line[0];
                      line_1[1] = line[1];
                      line_1[2] = line[2];
                      line_1[3] = line[3];
                      line_1[4] = line[4];
                      line_1[5] = line[5];
                      line_1[6] = line[6];
                      line_1[7] = line[7];
                      line_1._8_2_ = (undefined2)line._8_4_;
                      line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                      line_1._13_2_ = SUB42(line._12_4_,1);
                      line_1[0xf] = SUB41(line._12_4_,3);
                      line_1._20_4_ = line_1._20_4_ & 0xffffff00;
                      rtrim(line_1);
                      pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x108),
                                                    (coda_dynamic_type *)0x0,local_9f0.product,
                                                    line_1);
                      pcVar31 = "signal_strength_unit";
                    }
                    else if (CONCAT17(line[0x43],
                                      CONCAT16(line[0x42],
                                               CONCAT15(line[0x41],
                                                        CONCAT14(line[0x40],
                                                                 CONCAT13(line[0x3f],
                                                                          CONCAT12(line[0x3e],
                                                                                   CONCAT11(line[
                                                  0x3d],line[0x3c]))))))) == 0x4c41565245544e49) {
                      lVar34 = coda_ascii_parse_double(line,10,&double_value,0);
                      if (lVar34 < 0) goto LAB_00153290;
                      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x110),
                                                    (coda_dynamic_type *)0x0,local_9f0.product,
                                                    double_value);
                      pcVar31 = "obs_interval";
                    }
                    else {
                      iVar18 = bcmp(line + 0x3c,"TIME OF FIRST OBS",0x11);
                      uVar29 = line._23_4_;
                      uVar15 = line_1._41_2_;
                      cVar14 = line_1[0x28];
                      cVar13 = line_1[0x1f];
                      uVar12 = line_1._29_2_;
                      uVar11 = line_1._18_2_;
                      uVar10 = line_1._16_2_;
                      cVar9 = line_1[0xf];
                      uVar8 = line_1._13_2_;
                      uVar7 = line_1._8_2_;
                      line_1._41_2_ = SUB42(line._40_4_,1);
                      line_1[0x28] = (char)line._40_4_;
                      line_1._29_2_ = SUB42(line._28_4_,1);
                      line_1[0x1f] = SUB41(line._28_4_,3);
                      line_1._8_2_ = (undefined2)line._8_4_;
                      line_1._13_2_ = SUB42(line._12_4_,1);
                      line_1[0xf] = SUB41(line._12_4_,3);
                      line_1._16_2_ = (undefined2)line._16_4_;
                      line_1._18_2_ = SUB42(line._16_4_,2);
                      if (iVar18 == 0) {
                        line_1[0x20] = line[0x20];
                        line_1[0x21] = line[0x21];
                        line_1[0x22] = line[0x22];
                        line_1._20_4_ =
                             (undefined4)
                             (CONCAT17(line[0x17],
                                       CONCAT25(line._21_2_,CONCAT14(line[0x14],line._16_4_))) >>
                             0x20);
                        line_1[0x18] = line[0x18];
                        line_1[0x19] = line[0x19];
                        line_1[0x1a] = line[0x1a];
                        line_1._27_2_ =
                             (undefined2)
                             (CONCAT44(line._28_4_,CONCAT13(line[0x1b],line._24_3_)) >> 0x18);
                        line_1[4] = line[4];
                        line_1[5] = line[5];
                        line_1[6] = line[6];
                        line_1[7] = line[7];
                        line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                        line_1[0x2b] = '\0';
                        line._23_4_ = uVar29;
                        pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x120),
                                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                                      line_1);
                        pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x118),
                                                    (coda_dynamic_type *)0x0,
                                                    (coda_dynamic_type *)pcVar21);
                        coda_mem_record_add_field
                                  (local_9f0.header,"time_of_first_obs",(coda_dynamic_type *)pcVar25
                                   ,0);
                        line_1[0] = (char)line._48_2_;
                        line_1[1] = SUB21(line._48_2_,1);
                        line_1[2] = line[0x32];
                        if (CONCAT12(line[0x32],line._48_2_) == 0x202020) {
                          if (local_9f0.satellite_system == 'E') {
                            line_1[0] = 'G';
                            line_1[1] = 'A';
                            line_1[2] = 'L';
                          }
                          else if (local_9f0.satellite_system == 'R') {
                            line_1[0] = 'G';
                            line_1[1] = 'L';
                            line_1[2] = 'O';
                          }
                          else if (local_9f0.satellite_system == 'G') {
                            line_1[0] = 'G';
                            line_1[1] = 'P';
                            line_1[2] = 'S';
                          }
                        }
                        line_1[3] = '\0';
                        pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x138),
                                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                                      line_1);
                        pcVar31 = "time_of_first_obs_time_zone";
                      }
                      else {
                        auVar36[0] = -(line[0x3c] == 'T');
                        auVar36[1] = -(line[0x3d] == 'I');
                        auVar36[2] = -(line[0x3e] == 'M');
                        auVar36[3] = -(line[0x3f] == 'E');
                        auVar36[4] = -(line[0x40] == ' ');
                        auVar36[5] = -(line[0x41] == 'O');
                        auVar36[6] = -(line[0x42] == 'F');
                        auVar36[7] = -(line[0x43] == ' ');
                        auVar36[8] = -(line[0x44] == 'L');
                        auVar36[9] = -(line[0x45] == 'A');
                        auVar36[10] = -(line[0x46] == 'S');
                        auVar36[0xb] = -(line[0x47] == 'T');
                        auVar36[0xc] = -(line[0x48] == ' ');
                        auVar36[0xd] = -(line[0x49] == 'O');
                        auVar36[0xe] = -(line[0x4a] == 'B');
                        auVar36[0xf] = -(line[0x4b] == 'S');
                        if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar36[0xf] >> 7) << 0xf) == 0xffff) {
                          line_1[0x20] = line[0x20];
                          line_1[0x21] = line[0x21];
                          line_1[0x22] = line[0x22];
                          line_1._20_4_ =
                               (undefined4)
                               (CONCAT17(line[0x17],
                                         CONCAT25(line._21_2_,CONCAT14(line[0x14],line._16_4_))) >>
                               0x20);
                          line_1[0x18] = line[0x18];
                          line_1[0x19] = line[0x19];
                          line_1[0x1a] = line[0x1a];
                          line_1._27_2_ =
                               (undefined2)
                               (CONCAT44(line._28_4_,CONCAT13(line[0x1b],line._24_3_)) >> 0x18);
                          line_1[4] = line[4];
                          line_1[5] = line[5];
                          line_1[6] = line[6];
                          line_1[7] = line[7];
                          line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
                          line_1[0x2b] = '\0';
                          line._23_4_ = uVar29;
                          pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x130),
                                                        (coda_dynamic_type *)0x0,local_9f0.product,
                                                        line_1);
                          pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x128),
                                                      (coda_dynamic_type *)0x0,
                                                      (coda_dynamic_type *)pcVar21);
                          coda_mem_record_add_field
                                    (local_9f0.header,"time_of_last_obs",
                                     (coda_dynamic_type *)pcVar25,0);
                          line_1[0] = (char)line._48_2_;
                          line_1[1] = SUB21(line._48_2_,1);
                          line_1[2] = line[0x32];
                          if (CONCAT12(line[0x32],line._48_2_) == 0x202020) {
                            if (local_9f0.satellite_system == 'E') {
                              line_1[0] = 'G';
                              line_1[1] = 'A';
                              line_1[2] = 'L';
                            }
                            else if (local_9f0.satellite_system == 'R') {
                              line_1[0] = 'G';
                              line_1[1] = 'L';
                              line_1[2] = 'O';
                            }
                            else if (local_9f0.satellite_system == 'G') {
                              line_1[0] = 'G';
                              line_1[1] = 'P';
                              line_1[2] = 'S';
                            }
                          }
                          line_1[3] = '\0';
                          pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x138),
                                                        (coda_dynamic_type *)0x0,local_9f0.product,
                                                        line_1);
                          pcVar31 = "time_of_last_obs_time_zone";
                        }
                        else {
                          line_1._8_2_ = uVar7;
                          line_1._13_2_ = uVar8;
                          line_1[0xf] = cVar9;
                          line_1._16_2_ = uVar10;
                          line_1._18_2_ = uVar11;
                          line_1._29_2_ = uVar12;
                          line_1[0x1f] = cVar13;
                          line_1[0x28] = cVar14;
                          line_1._41_2_ = uVar15;
                          iVar18 = bcmp(line + 0x3c,"RCV CLOCK OFFS APPL",0x13);
                          if (iVar18 == 0) {
                            lVar34 = coda_ascii_parse_int64(line,6,&int_value,0);
                            if (lVar34 < 0) goto LAB_00153290;
                            pcVar21 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x140),
                                                         (coda_dynamic_type *)0x0,local_9f0.product,
                                                         (uint8_t)int_value);
                            pcVar31 = "rcv_clock_offs_appl";
                          }
                          else {
                            pcVar31 = line + 0x3c;
                            iVar18 = bcmp(pcVar31,"SYS / DCBS APPLIED",0x12);
                            if (((iVar18 == 0) ||
                                (iVar18 = bcmp(pcVar31,"SYS / PCVS APPLIED",0x12), iVar18 == 0)) ||
                               (iVar18 = bcmp(pcVar31,"SYS / SCALE FACTOR",0x12), iVar18 == 0))
                            goto LAB_001501e6;
                            iVar18 = bcmp(pcVar31,"LEAP SECONDS",0xc);
                            if (iVar18 == 0) {
                              lVar34 = coda_ascii_parse_int64(line,6,&int_value,0);
                              if (lVar34 < 0) {
LAB_00153290:
                                coda_add_error_message
                                          (" (line: %ld, byte offset: %ld)",local_9f0.linenumber,
                                           local_9f0.offset);
                                break;
                              }
                              pcVar21 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x148),
                                                           (coda_dynamic_type *)0x0,
                                                           local_9f0.product,(int32_t)int_value);
                              pcVar31 = "leap_seconds";
                            }
                            else {
                              iVar18 = bcmp(line + 0x3c,"# OF SATELLITES",0xf);
                              if (iVar18 != 0) {
                                iVar18 = bcmp(line + 0x3c,"PRN / # OF OBS",0xe);
                                if (iVar18 == 0) goto LAB_001501e6;
                                iVar18 = bcmp(line + 0x3c,"END OF HEADER",0xd);
                                if (iVar18 == 0) goto LAB_001532cf;
                                goto LAB_0014f5cf;
                              }
                              lVar34 = coda_ascii_parse_int64(line,6,&int_value,0);
                              if (lVar34 < 0) goto LAB_00153290;
                              pcVar21 = coda_mem_uint16_new(*(coda_type_number **)(*plVar1 + 0x150),
                                                            (coda_dynamic_type *)0x0,
                                                            local_9f0.product,(uint16_t)int_value);
                              pcVar31 = "num_satellites";
                            }
                          }
                        }
                      }
                    }
                    coda_mem_record_add_field
                              (local_9f0.header,pcVar31,(coda_dynamic_type *)pcVar21,0);
                  }
                }
              }
            }
LAB_001501e6:
            local_9f0.offset = ftell((FILE *)local_9f0.f);
            local_9f0.linenumber = local_9f0.linenumber + 1;
            uVar17 = get_line(local_9f0.f,line);
          }
        }
        else {
          local_9f0.sys_array =
               coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x100),(coda_dynamic_type *)0x0);
          local_9f0.offset = ftell((FILE *)local_9f0.f);
          local_9f0.linenumber = local_9f0.linenumber + 1;
          uVar17 = get_line(local_9f0.f,line);
          while (-1 < (int)uVar17) {
            if (uVar17 == 0) {
LAB_00152c79:
              coda_mem_record_add_field
                        (local_9f0.header,"sys",(coda_dynamic_type *)local_9f0.sys_array,0);
              local_9f0.sys_array = (coda_mem_array *)0x0;
              local_9f0.offset = ftell((FILE *)local_9f0.f);
              local_9f0.linenumber = local_9f0.linenumber + 1;
              iVar18 = coda_mem_record_validate(local_9f0.header);
              if (iVar18 == 0) {
                pcVar24 = coda_type_array_new(coda_format_rinex);
                coda_type_array_add_variable_dimension(pcVar24,(coda_expression *)0x0);
                coda_type_array_set_base_type(pcVar24,*(coda_type **)(*plVar1 + 0x478));
                local_9f0.records = coda_mem_array_new(pcVar24,(coda_dynamic_type *)0x0);
                coda_type_release((coda_type *)pcVar24);
                local_9f0.offset = ftell((FILE *)local_9f0.f);
                local_9f0.linenumber = local_9f0.linenumber + 1;
                uVar17 = get_line(local_9f0.f,line);
                if (-1 < (int)uVar17) {
                  local_888 = &local_9f0.records;
                  goto LAB_00152d56;
                }
              }
              break;
            }
            if (uVar17 < 0x3d) goto LAB_00151500;
            iVar18 = bcmp(pcVar31,"PGM / RUN BY / DATE",0x13);
            if (iVar18 == 0) {
              line_1._16_2_ = (undefined2)line._16_4_;
              line_1._18_2_ = SUB42(line._16_4_,2);
              line_1._8_2_ = (undefined2)line._8_4_;
              line_1._10_3_ = (undefined3)(CONCAT44(line._12_4_,line._8_4_) >> 0x10);
              line_1._13_2_ = SUB42(line._12_4_,1);
              line_1[0xf] = SUB41(line._12_4_,3);
              line_1._20_4_ = line_1._20_4_ & 0xffffff00;
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x18),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              coda_mem_record_add_field(local_9f0.header,"program",(coda_dynamic_type *)pcVar21,0);
              line_1[1] = (char)line._21_2_;
              line_1[2] = SUB21(line._21_2_,1);
              line_1[3] = (char)line._23_4_;
              line_1[4] = SUB41(line._23_4_,1);
              line_1[5] = SUB41(line._23_4_,2);
              line_1[6] = SUB41(line._23_4_,3);
              line_1._8_2_ = (undefined2)line._28_4_;
              line_1._10_3_ = (undefined3)(CONCAT24(line._32_2_,line._28_4_) >> 0x10);
              line_1._13_2_ =
                   (undefined2)(CONCAT16(line[0x22],CONCAT24(line._32_2_,line._28_4_)) >> 0x28);
              line_1._16_2_ = (undefined2)line._36_4_;
              line_1._18_2_ = SUB42(line._36_4_,2);
              rtrim(line_1);
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x20),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              coda_mem_record_add_field(local_9f0.header,"run_by",(coda_dynamic_type *)pcVar21,0);
              line_1[0] = (char)line._40_4_;
              line_1[1] = SUB41(line._40_4_,1);
              line_1[2] = SUB41(line._40_4_,2);
              line_1[3] = SUB41(line._40_4_,3);
              line_1[4] = (char)line._44_4_;
              line_1[5] = SUB41(line._44_4_,1);
              line_1[6] = SUB41(line._44_4_,2);
              line_1[7] = line[0x2f];
              line_1[8] = line[0x30];
              line_1[9] = line[0x31];
              line_1._10_3_ = (undefined3)CONCAT41(line._51_4_,line[0x32]);
              line_1._13_2_ = SUB42(line._51_4_,2);
              line_1[0xf] = '\0';
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x30),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x28),
                                          (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
              coda_mem_record_add_field(local_9f0.header,"datetime",(coda_dynamic_type *)pcVar25,0);
              line_1[0] = (char)line._56_2_;
              line_1[1] = SUB21(line._56_2_,1);
              line_1[2] = line[0x3a];
              line_1[3] = '\0';
              pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x38),
                                            (coda_dynamic_type *)0x0,local_9f0.product,line_1);
              pcVar32 = "datetime_time_zone";
              goto LAB_001513f0;
            }
            iVar18 = bcmp(pcVar31,"COMMENT",7);
            if (iVar18 != 0) {
              iVar18 = bcmp(pcVar31,"SYS / # / OBS TYPES",0x13);
              if (iVar18 == 0) {
                iVar18 = handle_observation_definition(&local_9f0,line);
                if (iVar18 != 0) break;
              }
              else {
                iVar18 = bcmp(pcVar31,"TIME SYSTEM ID",0xe);
                if (iVar18 == 0) {
                  line_1[2] = line[5];
                  line_1[0] = line[3];
                  line_1[1] = line[4];
                  line_1[3] = '\0';
                  rtrim(line_1);
                  pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x158),
                                                (coda_dynamic_type *)0x0,local_9f0.product,line_1);
                  pcVar32 = "time_system_id";
                }
                else {
                  iVar18 = bcmp(pcVar31,"LEAP SECONDS",0xc);
                  if (iVar18 != 0) {
                    iVar18 = bcmp(pcVar31,"SYS / DCBS APPLIED",0x12);
                    if ((((((iVar18 == 0) ||
                           (iVar18 = bcmp(pcVar31,"SYS / PCVS APPLIED",0x12), iVar18 == 0)) ||
                          (iVar18 = bcmp(pcVar31,"# / TYPES OF DATA",0x11), iVar18 == 0)) ||
                         ((iVar18 = bcmp(pcVar31,"STATION NAME / NUM",0x12), iVar18 == 0 ||
                          (iVar18 = bcmp(pcVar31,"STATION CLK REF",0xf), iVar18 == 0)))) ||
                        (iVar18 = bcmp(pcVar31,"ANALYSIS CENTER",0xf), iVar18 == 0)) ||
                       (((iVar18 = bcmp(pcVar31,"# OF CLK REF",0xc), iVar18 == 0 ||
                         (auVar39[0] = -(line[0x3c] == 'A'), auVar39[1] = -(line[0x3d] == 'N'),
                         auVar39[2] = -(line[0x3e] == 'A'), auVar39[3] = -(line[0x3f] == 'L'),
                         auVar39[4] = -(line[0x40] == 'Y'), auVar39[5] = -(line[0x41] == 'S'),
                         auVar39[6] = -(line[0x42] == 'I'), auVar39[7] = -(line[0x43] == 'S'),
                         auVar39[8] = -(line[0x44] == ' '), auVar39[9] = -(line[0x45] == 'C'),
                         auVar39[10] = -(line[0x46] == 'L'), auVar39[0xb] = -(line[0x47] == 'K'),
                         auVar39[0xc] = -(line[0x48] == ' '), auVar39[0xd] = -(line[0x49] == 'R'),
                         auVar39[0xe] = -(line[0x4a] == 'E'), auVar39[0xf] = -(line[0x4b] == 'F'),
                         (ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar39[0xf] >> 7) << 0xf) == 0xffff)) ||
                        ((iVar18 = bcmp(pcVar31,"# OF SOLN STA / TRF",0x13), iVar18 == 0 ||
                         (((iVar18 = bcmp(pcVar31,"SOLN STA NAME / NUM",0x13), iVar18 == 0 ||
                           (iVar18 = bcmp(pcVar31,"# OF SOLN SATS",0xe), iVar18 == 0)) ||
                          (CONCAT17(line[0x43],
                                    CONCAT16(line[0x42],
                                             CONCAT15(line[0x41],
                                                      CONCAT14(line[0x40],
                                                               CONCAT13(line[0x3f],
                                                                        CONCAT12(line[0x3e],
                                                                                 CONCAT11(line[0x3d]
                                                                                          ,line[0x3c
                                                  ]))))))) == 0x5453494c204e5250))))))))
                    goto LAB_00151411;
                    iVar18 = bcmp(pcVar31,"END OF HEADER",0xd);
                    if (iVar18 == 0) goto LAB_00152c79;
                    goto LAB_0014f5cf;
                  }
                  lVar20 = coda_ascii_parse_int64(line,6,(int64_t *)&double_value,0);
                  lVar34 = local_9f0.offset;
                  if (lVar20 < 0) goto LAB_00151529;
                  pcVar21 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x148),
                                               (coda_dynamic_type *)0x0,local_9f0.product,
                                               double_value._0_4_);
                  pcVar32 = "leap_seconds";
                }
LAB_001513f0:
                coda_mem_record_add_field(local_9f0.header,pcVar32,(coda_dynamic_type *)pcVar21,0);
              }
            }
LAB_00151411:
            local_9f0.offset = ftell((FILE *)local_9f0.f);
            local_9f0.linenumber = local_9f0.linenumber + 1;
            uVar17 = get_line(local_9f0.f,line);
          }
        }
        goto LAB_0014f5f7;
      }
      pcVar31 = "RINEX format version %3.2f is not supported for Clock data";
    }
    else if (line[0x14] == 'N') {
      if ((local_9f0.format_version == 3.0) && (!NAN(local_9f0.format_version))) {
        lVar34 = 0x3f8;
        goto LAB_0014f6fe;
      }
      pcVar31 = "RINEX format version %3.2f is not supported for Navigation data";
    }
    else {
      if (line[0x14] != 'O') {
        coda_set_error(-200,"RINEX file type \'%c\' is not supported",(ulong)(uint)(int)line[0x14]);
        goto LAB_0014f5f7;
      }
      if ((local_9f0.format_version == 3.0) && (!NAN(local_9f0.format_version))) {
        lVar34 = 0x1a8;
        goto LAB_0014f6fe;
      }
      pcVar31 = "RINEX format version %3.2f is not supported for Observation data";
    }
    coda_set_error(-200,pcVar31);
    goto LAB_0014f5f7;
  }
LAB_0014f5cf:
  pcVar31 = line + 0x3c;
  pcVar32 = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
  lVar34 = local_9f0.offset + 0x3c;
  goto LAB_0014f5f0;
  while( true ) {
    local_9f0.offset = ftell((FILE *)local_9f0.f);
    local_9f0.linenumber = local_9f0.linenumber + 1;
    uVar17 = get_line(local_9f0.f,line);
    if ((int)uVar17 < 0) break;
LAB_00151680:
    cVar9 = line[0];
    if (uVar17 == 0) {
      pcVar27 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x420),(coda_dynamic_type *)0x0
                                   );
      coda_mem_record_add_field(pcVar27,"header",(coda_dynamic_type *)local_9f0.header,0);
      local_9f0.header = (coda_mem_record *)0x0;
      coda_mem_record_add_field
                (pcVar27,"gps",
                 (coda_dynamic_type *)
                 CONCAT44(local_9f0.gps.records._4_4_,local_9f0.gps.records._0_4_),0);
      local_9f0.gps.records._0_4_ = 0;
      local_9f0.gps.records._4_4_ = 0;
      coda_mem_record_add_field
                (pcVar27,"glonass",
                 (coda_dynamic_type *)
                 CONCAT44(local_9f0.glonass.records._4_4_,local_9f0.glonass.records._0_4_),0);
      local_9f0.glonass.records._0_4_ = 0;
      local_9f0.glonass.records._4_4_ = 0;
      coda_mem_record_add_field
                (pcVar27,"galileo",
                 (coda_dynamic_type *)
                 CONCAT44(local_9f0.galileo.records._4_4_,local_9f0.galileo.records._0_4_),0);
      local_9f0.galileo.records._0_4_ = 0;
      local_9f0.galileo.records._4_4_ = 0;
      pcVar31 = "sbas";
      iVar18 = 0;
      pcVar26 = local_9f0.sbas.records;
      goto LAB_00153ac1;
    }
    if (uVar17 < 0x17) goto LAB_00153243;
    if (line[0] == 'E') {
      lVar34 = 1000;
    }
    else if (line[0] == 'G') {
      lVar34 = 0x3d8;
    }
    else if (line[0] == 'S') {
      lVar34 = 0x3f0;
    }
    else {
      if (line[0] != 'R') {
        pcVar31 = "invalid satellite system for navigation record (line: %ld, byte offset: %ld)";
        lVar34 = local_9f0.offset;
        goto LAB_00153b9f;
      }
      lVar34 = 0x3e0;
    }
    pcVar27 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + lVar34),(coda_dynamic_type *)0x0)
    ;
    double_value._0_3_ = (uint3)CONCAT11(line[2],line[1]);
    iVar18 = __isoc99_sscanf(&double_value,"%2d",str_1);
    if (iVar18 != 1) goto LAB_00153b80;
    pcVar21 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x180),(coda_dynamic_type *)0x0,
                                 local_9f0.product,str_1[0]);
    coda_mem_record_add_field(pcVar27,"number",(coda_dynamic_type *)pcVar21,0);
    int_value = CONCAT44(line._8_4_,CONCAT13(line[7],CONCAT12(line[6],CONCAT11(line[5],line[4]))));
    acStack_8c0 = SUB43(line._12_4_,0);
    uStack_8bd = (undefined4)(CONCAT44(line._16_4_,line._12_4_) >> 0x18);
    uStack_8b9 = CONCAT22(line._21_2_,CONCAT11(line[0x14],line[0x13]));
    local_8b5 = local_8b5 & 0xffffffffffffff00;
    pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x160),(coda_dynamic_type *)0x0,
                                  local_9f0.product,(char *)&int_value);
    pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x220),(coda_dynamic_type *)0x0,
                                (coda_dynamic_type *)pcVar21);
    coda_mem_record_add_field(pcVar27,"epoch",(coda_dynamic_type *)pcVar25,0);
    if (cVar9 == 'E') {
      iVar18 = read_navigation_record_values(&local_9f0,line,0x1c,(double *)line_1);
      if (iVar18 != 0) {
LAB_00152bdc:
        coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
        break;
      }
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x228),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,
                                    (double)CONCAT17(line_1[7],
                                                     CONCAT16(line_1[6],
                                                              CONCAT15(line_1[5],
                                                                       CONCAT14(line_1[4],
                                                                                CONCAT13(line_1[3],
                                                                                         CONCAT12(
                                                  line_1[2],CONCAT11(line_1[1],line_1[0]))))))));
      coda_mem_record_add_field(pcVar27,"sv_clock_bias",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x230),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,
                                    (double)CONCAT17(line_1[0xf],
                                                     CONCAT25(line_1._13_2_,
                                                              CONCAT32(line_1._10_3_,line_1._8_2_)))
                                   );
      coda_mem_record_add_field(pcVar27,"sv_clock_drift",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x238),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,
                                    (double)CONCAT44(line_1._20_4_,
                                                     CONCAT22(line_1._18_2_,line_1._16_2_)));
      coda_mem_record_add_field(pcVar27,"sv_clock_drift_rate",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x310),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,
                                    (double)CONCAT17(line_1[0x1f],
                                                     CONCAT25(line_1._29_2_,
                                                              CONCAT23(line_1._27_2_,line_1._24_3_))
                                                    ));
      coda_mem_record_add_field(pcVar27,"iodnav",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x248),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,
                                    (double)CONCAT53(line_1._35_5_,
                                                     CONCAT12(line_1[0x22],line_1._32_2_)));
      coda_mem_record_add_field(pcVar27,"crs",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x250),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,
                                    (double)CONCAT44(line_1._44_4_,
                                                     CONCAT13(line_1[0x2b],
                                                              CONCAT21(line_1._41_2_,line_1[0x28])))
                                   );
      coda_mem_record_add_field(pcVar27,"delta_n",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 600),(coda_dynamic_type *)0x0,
                                    local_9f0.product,(double)CONCAT44(line_1._52_4_,line_1._48_4_))
      ;
      coda_mem_record_add_field(pcVar27,"m0",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x260),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)CONCAT44(line_1._60_4_,line_1._56_4_)
                                   );
      coda_mem_record_add_field(pcVar27,"cuc",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x268),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._64_8_);
      coda_mem_record_add_field(pcVar27,"e",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x270),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._72_8_);
      coda_mem_record_add_field(pcVar27,"cus",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x278),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._80_8_);
      coda_mem_record_add_field(pcVar27,"sqrt_a",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x280),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._88_8_);
      coda_mem_record_add_field(pcVar27,"toe",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x288),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._96_8_);
      coda_mem_record_add_field(pcVar27,"cic",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x290),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._104_8_);
      coda_mem_record_add_field(pcVar27,"omega0",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x298),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._112_8_);
      coda_mem_record_add_field(pcVar27,"cis",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2a0),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._120_8_);
      coda_mem_record_add_field(pcVar27,"i0",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2a8),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._128_8_);
      coda_mem_record_add_field(pcVar27,"crc",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2b0),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._136_8_);
      coda_mem_record_add_field(pcVar27,"omega",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2b8),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._144_8_);
      coda_mem_record_add_field(pcVar27,"omega_dot",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2c0),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._152_8_);
      coda_mem_record_add_field(pcVar27,"idot",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_uint32_new(*(coda_type_number **)(*plVar1 + 0x318),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(uint32_t)(long)(double)line_1._160_8_);
      coda_mem_record_add_field(pcVar27,"data_sources",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 800),(coda_dynamic_type *)0x0,
                                    local_9f0.product,(double)line_1._168_8_);
      coda_mem_record_add_field(pcVar27,"gal_week",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x328),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._184_8_);
      coda_mem_record_add_field(pcVar27,"sisa",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_uint32_new(*(coda_type_number **)(*plVar1 + 0x330),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(uint32_t)(long)(double)line_1._192_8_);
      coda_mem_record_add_field(pcVar27,"sv_health",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x338),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._200_8_);
      coda_mem_record_add_field(pcVar27,"bgd_e5a_e1",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x340),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._208_8_);
      coda_mem_record_add_field(pcVar27,"bgd_e5b_e1",(coda_dynamic_type *)pcVar21,0);
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x348),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)line_1._216_8_);
      coda_mem_record_add_field(pcVar27,"transmission_time",(coda_dynamic_type *)pcVar21,0);
      ppcVar23 = &local_9f0.galileo.records;
LAB_00152a33:
      coda_mem_array_add_element(*ppcVar23,(coda_dynamic_type *)pcVar27);
    }
    else {
      if (cVar9 == 'S') {
        iVar18 = read_navigation_record_values(&local_9f0,line,0xf,(double *)line_1);
        if (iVar18 != 0) goto LAB_00152bdc;
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x228),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[7],
                                                       CONCAT16(line_1[6],
                                                                CONCAT15(line_1[5],
                                                                         CONCAT14(line_1[4],
                                                                                  CONCAT13(line_1[3]
                                                  ,CONCAT12(line_1[2],CONCAT11(line_1[1],line_1[0]))
                                                  ))))));
        coda_mem_record_add_field(pcVar27,"sv_clock_bias",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x350),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[0xf],
                                                       CONCAT25(line_1._13_2_,
                                                                CONCAT32(line_1._10_3_,line_1._8_2_)
                                                               )));
        coda_mem_record_add_field(pcVar27,"sv_rel_freq_bias",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3c0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._20_4_,
                                                       CONCAT22(line_1._18_2_,line_1._16_2_)));
        coda_mem_record_add_field(pcVar27,"transmission_time",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x360),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[0x1f],
                                                       CONCAT25(line_1._29_2_,
                                                                CONCAT23(line_1._27_2_,line_1._24_3_
                                                                        ))));
        coda_mem_record_add_field(pcVar27,"sat_pos_x",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x378),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT53(line_1._35_5_,
                                                       CONCAT12(line_1[0x22],line_1._32_2_)));
        coda_mem_record_add_field(pcVar27,"sat_vel_x",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x390),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._44_4_,
                                                       CONCAT13(line_1[0x2b],
                                                                CONCAT21(line_1._41_2_,line_1[0x28])
                                                               )));
        coda_mem_record_add_field(pcVar27,"sat_acc_x",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3a8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._52_4_,line_1._48_4_));
        coda_mem_record_add_field(pcVar27,"sat_health",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x368),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._60_4_,line_1._56_4_));
        coda_mem_record_add_field(pcVar27,"sat_pos_y",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x380),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._64_8_);
        coda_mem_record_add_field(pcVar27,"sat_vel_y",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x398),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._72_8_);
        coda_mem_record_add_field(pcVar27,"sat_acc_y",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3c8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._80_8_);
        coda_mem_record_add_field(pcVar27,"sat_accuracy_code",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x370),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._88_8_);
        coda_mem_record_add_field(pcVar27,"sat_pos_z",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x388),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._96_8_);
        coda_mem_record_add_field(pcVar27,"sat_vel_z",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3a0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._104_8_);
        coda_mem_record_add_field(pcVar27,"sat_acc_z",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3d0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._112_8_);
        coda_mem_record_add_field(pcVar27,"iodn",(coda_dynamic_type *)pcVar21,0);
        ppcVar23 = &local_9f0.sbas.records;
        goto LAB_00152a33;
      }
      if (cVar9 == 'R') {
        iVar18 = read_navigation_record_values(&local_9f0,line,0xf,(double *)line_1);
        if (iVar18 != 0) goto LAB_00152bdc;
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x228),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[7],
                                                       CONCAT16(line_1[6],
                                                                CONCAT15(line_1[5],
                                                                         CONCAT14(line_1[4],
                                                                                  CONCAT13(line_1[3]
                                                  ,CONCAT12(line_1[2],CONCAT11(line_1[1],line_1[0]))
                                                  ))))));
        coda_mem_record_add_field(pcVar27,"sv_clock_bias",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x350),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[0xf],
                                                       CONCAT25(line_1._13_2_,
                                                                CONCAT32(line_1._10_3_,line_1._8_2_)
                                                               )));
        coda_mem_record_add_field(pcVar27,"sv_rel_freq_bias",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x358),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._20_4_,
                                                       CONCAT22(line_1._18_2_,line_1._16_2_)));
        coda_mem_record_add_field(pcVar27,"msg_frame_time",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x360),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[0x1f],
                                                       CONCAT25(line_1._29_2_,
                                                                CONCAT23(line_1._27_2_,line_1._24_3_
                                                                        ))));
        coda_mem_record_add_field(pcVar27,"sat_pos_x",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x378),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT53(line_1._35_5_,
                                                       CONCAT12(line_1[0x22],line_1._32_2_)));
        coda_mem_record_add_field(pcVar27,"sat_vel_x",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x390),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._44_4_,
                                                       CONCAT13(line_1[0x2b],
                                                                CONCAT21(line_1._41_2_,line_1[0x28])
                                                               )));
        coda_mem_record_add_field(pcVar27,"sat_acc_x",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3a8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._52_4_,line_1._48_4_));
        coda_mem_record_add_field(pcVar27,"sat_health",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x368),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._60_4_,line_1._56_4_));
        coda_mem_record_add_field(pcVar27,"sat_pos_y",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x380),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._64_8_);
        coda_mem_record_add_field(pcVar27,"sat_vel_y",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x398),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._72_8_);
        coda_mem_record_add_field(pcVar27,"sat_acc_y",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3b0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._80_8_);
        coda_mem_record_add_field(pcVar27,"sat_frequency_number",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x370),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._88_8_);
        coda_mem_record_add_field(pcVar27,"sat_pos_z",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x388),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._96_8_);
        coda_mem_record_add_field(pcVar27,"sat_vel_z",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3a0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._104_8_);
        coda_mem_record_add_field(pcVar27,"sat_acc_z",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x3b8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._112_8_);
        coda_mem_record_add_field(pcVar27,"age_of_oper_info",(coda_dynamic_type *)pcVar21,0);
        ppcVar23 = &local_9f0.glonass.records;
        goto LAB_00152a33;
      }
      if (cVar9 == 'G') {
        iVar18 = read_navigation_record_values(&local_9f0,line,0x1d,(double *)line_1);
        if (iVar18 != 0) goto LAB_00152bdc;
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x228),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[7],
                                                       CONCAT16(line_1[6],
                                                                CONCAT15(line_1[5],
                                                                         CONCAT14(line_1[4],
                                                                                  CONCAT13(line_1[3]
                                                  ,CONCAT12(line_1[2],CONCAT11(line_1[1],line_1[0]))
                                                  ))))));
        coda_mem_record_add_field(pcVar27,"sv_clock_bias",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x230),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[0xf],
                                                       CONCAT25(line_1._13_2_,
                                                                CONCAT32(line_1._10_3_,line_1._8_2_)
                                                               )));
        coda_mem_record_add_field(pcVar27,"sv_clock_drift",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x238),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._20_4_,
                                                       CONCAT22(line_1._18_2_,line_1._16_2_)));
        coda_mem_record_add_field(pcVar27,"sv_clock_drift_rate",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x240),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT17(line_1[0x1f],
                                                       CONCAT25(line_1._29_2_,
                                                                CONCAT23(line_1._27_2_,line_1._24_3_
                                                                        ))));
        coda_mem_record_add_field(pcVar27,"iode",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x248),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT53(line_1._35_5_,
                                                       CONCAT12(line_1[0x22],line_1._32_2_)));
        coda_mem_record_add_field(pcVar27,"crs",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x250),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._44_4_,
                                                       CONCAT13(line_1[0x2b],
                                                                CONCAT21(line_1._41_2_,line_1[0x28])
                                                               )));
        coda_mem_record_add_field(pcVar27,"delta_n",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 600),(coda_dynamic_type *)0x0
                                      ,local_9f0.product,
                                      (double)CONCAT44(line_1._52_4_,line_1._48_4_));
        coda_mem_record_add_field(pcVar27,"m0",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x260),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)CONCAT44(line_1._60_4_,line_1._56_4_));
        coda_mem_record_add_field(pcVar27,"cuc",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x268),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._64_8_);
        coda_mem_record_add_field(pcVar27,"e",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x270),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._72_8_);
        coda_mem_record_add_field(pcVar27,"cus",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x278),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._80_8_);
        coda_mem_record_add_field(pcVar27,"sqrt_a",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x280),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._88_8_);
        coda_mem_record_add_field(pcVar27,"toe",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x288),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._96_8_);
        coda_mem_record_add_field(pcVar27,"cic",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x290),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._104_8_);
        coda_mem_record_add_field(pcVar27,"omega0",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x298),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._112_8_);
        coda_mem_record_add_field(pcVar27,"cis",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2a0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._120_8_);
        coda_mem_record_add_field(pcVar27,"i0",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2a8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._128_8_);
        coda_mem_record_add_field(pcVar27,"crc",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2b0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._136_8_);
        coda_mem_record_add_field(pcVar27,"omega",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2b8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._144_8_);
        coda_mem_record_add_field(pcVar27,"omega_dot",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2c0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._152_8_);
        coda_mem_record_add_field(pcVar27,"idot",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2c8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._160_8_);
        coda_mem_record_add_field(pcVar27,"l2_codes",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2d0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._168_8_);
        coda_mem_record_add_field(pcVar27,"gps_week",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2d8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._176_8_);
        coda_mem_record_add_field(pcVar27,"l2_p_data_flag",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2e0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._184_8_);
        coda_mem_record_add_field(pcVar27,"sv_accuracy",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2e8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._192_8_);
        coda_mem_record_add_field(pcVar27,"sv_health_gps",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2f0),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._200_8_);
        coda_mem_record_add_field(pcVar27,"tgd",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x2f8),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._208_8_);
        coda_mem_record_add_field(pcVar27,"iodc",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x300),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._216_8_);
        coda_mem_record_add_field(pcVar27,"transmission_time",(coda_dynamic_type *)pcVar21,0);
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x308),
                                      (coda_dynamic_type *)0x0,local_9f0.product,
                                      (double)line_1._224_8_);
        coda_mem_record_add_field(pcVar27,"fit_interval",(coda_dynamic_type *)pcVar21,0);
        ppcVar23 = &local_9f0.gps.records;
        goto LAB_00152a33;
      }
    }
  }
  goto LAB_0014f5f7;
LAB_00152d56:
  do {
    if (uVar17 == 0) goto LAB_00153a6e;
    if (uVar17 < 0x28) {
LAB_0015323b:
      pcVar31 = (char *)(ulong)uVar17;
      goto LAB_00153ae9;
    }
    local_9f0.epoch_record =
         coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x478),(coda_dynamic_type *)0x0);
    line_1[2] = '\0';
    rtrim(line_1);
    pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x428),(coda_dynamic_type *)0x0,
                                  local_9f0.product,line_1);
    coda_mem_record_add_field(local_9f0.epoch_record,"type",(coda_dynamic_type *)pcVar21,0);
    line_1[4] = '\0';
    rtrim(line_1);
    pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x430),(coda_dynamic_type *)0x0,
                                  local_9f0.product,line_1);
    coda_mem_record_add_field(local_9f0.epoch_record,"name",(coda_dynamic_type *)pcVar21,0);
    double_value = (double)CONCAT44(line._12_4_,line._8_4_);
    uStack_870 = (undefined3)line._16_4_;
    uStack_86d = (undefined5)
                 CONCAT44(line._23_4_,CONCAT22(line._21_2_,CONCAT11(line[0x14],line[0x13])));
    uStack_868 = SUB43(line._23_4_,1);
    local_85d = 0;
    pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x160),(coda_dynamic_type *)0x0,
                                  local_9f0.product,(char *)&double_value);
    pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x438),(coda_dynamic_type *)0x0,
                                (coda_dynamic_type *)pcVar21);
    coda_mem_record_add_field(local_9f0.epoch_record,"epoch",(coda_dynamic_type *)pcVar25,0);
    line_1[0] = line[0x22];
    line_1[1] = line[0x23];
    line_1[2] = line[0x24];
    line_1[3] = '\0';
    iVar18 = __isoc99_sscanf(line_1,"%3d",str_1);
    if ((iVar18 != 1) || (str_1._0_4_ - 7 < 0xfffffffa)) {
      pcVar31 = 
      "invalid \'number of data values\' entry in clock record (line: %ld, byte offset: %ld)";
      lVar34 = local_9f0.offset + 0x22;
      goto LAB_00153b9f;
    }
    lVar20 = coda_ascii_parse_double(line + 0x28,0x13,(double *)&int_value,0);
    lVar34 = local_9f0.offset;
    if (lVar20 < 0) goto LAB_00151529;
    pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x440),(coda_dynamic_type *)0x0,
                                  local_9f0.product,(double)int_value);
    coda_mem_record_add_field(local_9f0.epoch_record,"bias",(coda_dynamic_type *)pcVar21,0);
    if (1 < (int)str_1._0_4_) {
      if (uVar17 < 0x4f) goto LAB_0015323b;
      lVar20 = coda_ascii_parse_double(line + 0x3c,0x13,(double *)&int_value,0);
      lVar34 = local_9f0.offset;
      if (lVar20 < 0) goto LAB_00151529;
      pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x448),(coda_dynamic_type *)0x0
                                    ,local_9f0.product,(double)int_value);
      coda_mem_record_add_field(local_9f0.epoch_record,"bias_sigma",(coda_dynamic_type *)pcVar21,0);
      if (2 < (int)str_1._0_4_) {
        local_9f0.offset = ftell((FILE *)local_9f0.f);
        local_9f0.linenumber = local_9f0.linenumber + 1;
        uVar17 = get_line(local_9f0.f,line);
        if ((int)uVar17 < 0) break;
        if ((int)uVar17 < str_1._0_4_ * 0x14 + -0x29) goto LAB_00153243;
        lVar20 = coda_ascii_parse_double(line,0x13,(double *)&int_value,0);
        lVar34 = local_9f0.offset;
        if (lVar20 < 0) goto LAB_00151529;
        pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x450),
                                      (coda_dynamic_type *)0x0,local_9f0.product,(double)int_value);
        coda_mem_record_add_field(local_9f0.epoch_record,"rate",(coda_dynamic_type *)pcVar21,0);
        if (3 < (int)str_1._0_4_) {
          lVar20 = coda_ascii_parse_double(line + 0x14,0x13,(double *)&int_value,0);
          lVar34 = local_9f0.offset;
          if (lVar20 < 0) goto LAB_00151529;
          pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x458),
                                        (coda_dynamic_type *)0x0,local_9f0.product,(double)int_value
                                       );
          coda_mem_record_add_field
                    (local_9f0.epoch_record,"rate_sigma",(coda_dynamic_type *)pcVar21,0);
          if (4 < (int)str_1._0_4_) {
            lVar34 = coda_ascii_parse_double(line + 0x28,0x13,(double *)&int_value,0);
            if (lVar34 < 0) {
LAB_0015326a:
              coda_add_error_message
                        (" (line: %ld, byte offset: %ld)",local_9f0.linenumber,local_9f0.offset);
              break;
            }
            pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x460),
                                          (coda_dynamic_type *)0x0,local_9f0.product,
                                          (double)int_value);
            coda_mem_record_add_field
                      (local_9f0.epoch_record,"acceleration",(coda_dynamic_type *)pcVar21,0);
            if (5 < (int)str_1._0_4_) {
              lVar34 = coda_ascii_parse_double(line + 0x3c,0x13,(double *)&int_value,0);
              if (lVar34 < 0) goto LAB_0015326a;
              pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x468),
                                            (coda_dynamic_type *)0x0,local_9f0.product,
                                            (double)int_value);
              coda_mem_record_add_field
                        (local_9f0.epoch_record,"acceleration_sigma",(coda_dynamic_type *)pcVar21,0)
              ;
            }
          }
        }
      }
    }
    coda_mem_array_add_element(local_9f0.records,(coda_dynamic_type *)local_9f0.epoch_record);
    local_9f0.epoch_record = (coda_mem_record *)0x0;
    local_9f0.offset = ftell((FILE *)local_9f0.f);
    local_9f0.linenumber = local_9f0.linenumber + 1;
    uVar17 = get_line(local_9f0.f,line);
  } while (-1 < (int)uVar17);
  goto LAB_0014f5f7;
LAB_00153243:
  pcVar31 = (char *)(ulong)uVar17;
LAB_00153ae9:
  pcVar32 = "record line length (%ld) too short (line: %ld, byte offset: %ld)";
  lVar34 = local_9f0.offset;
LAB_0014f5f0:
  coda_set_error(-0x16,pcVar32,pcVar31,local_9f0.linenumber,lVar34);
  goto LAB_0014f5f7;
LAB_00151500:
  pcVar31 = (char *)(ulong)uVar17;
LAB_0014f57f:
  pcVar32 = "header line length (%ld) too short (line: %ld, byte offset: %ld)";
  lVar34 = local_9f0.offset;
  goto LAB_0014f5f0;
LAB_00153b80:
  coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
  pcVar31 = "invalid satellite number (line: %ld, byte offset: %ld)";
  lVar34 = local_9f0.offset + 1;
LAB_00153b9f:
  coda_set_error(-0x16,pcVar31,local_9f0.linenumber,lVar34);
  goto LAB_0014f5f7;
  while( true ) {
    if (line_1[0] != '>') {
      pcVar31 = "expected \'>\' as start of epoch record (line: %ld, byte offset: %ld)";
      lVar34 = local_9f0.offset;
      goto LAB_00153b9f;
    }
    local_9f0.epoch_record =
         coda_mem_record_new(local_9f0.epoch_record_definition,(coda_dynamic_type *)0x0);
    int_value = CONCAT26(line_1._8_2_,
                         CONCAT15(line_1[7],
                                  CONCAT14(line_1[6],
                                           CONCAT13(line_1[5],
                                                    CONCAT12(line_1[4],CONCAT11(line_1[3],line_1[2])
                                                            )))));
    acStack_8c0[0] = line_1[10];
    acStack_8c0[1] = line_1[0xb];
    acStack_8c0[2] = line_1[0xc];
    uVar5 = CONCAT23(line_1._16_2_,CONCAT12(line_1[0xf],line_1._13_2_));
    local_8b5 = CONCAT26(line_1._27_2_,CONCAT33(line_1._24_3_,line_1._21_3_));
    uStack_8bd = (undefined4)uVar5;
    uStack_8b9 = (undefined4)(CONCAT17(line_1[0x14],CONCAT25(line_1._18_2_,uVar5)) >> 0x20);
    local_8ad = 0;
    pcVar21 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x160),(coda_dynamic_type *)0x0,
                                  local_9f0.product,(char *)&int_value);
    pcVar25 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x168),(coda_dynamic_type *)0x0,
                                (coda_dynamic_type *)pcVar21);
    coda_mem_record_add_field(local_9f0.epoch_record,"epoch",(coda_dynamic_type *)pcVar25,0);
    cVar9 = line_1[0x1f];
    pcVar21 = coda_mem_char_new(*(coda_type_text **)(*plVar1 + 0x170),(coda_dynamic_type *)0x0,
                                local_9f0.product,line_1[0x1f]);
    coda_mem_record_add_field(local_9f0.epoch_record,"flag",(coda_dynamic_type *)pcVar21,0);
    dVar6 = double_value;
    double_value._0_3_ = CONCAT12(line_1[0x22],line_1._32_2_);
    double_value._4_4_ = SUB84(dVar6,4);
    double_value._0_4_ = (uint)double_value._0_3_;
    iVar18 = __isoc99_sscanf(&double_value,"%3d",&local_88c);
    if (iVar18 != 1) {
      pcVar31 = 
      "invalid \'number of satellites\' entry in epoch record (line: %ld, byte offset: %ld)";
      lVar34 = local_9f0.offset + 0x22;
      goto LAB_00153b9f;
    }
    if (uVar17 < 0x38) {
      double_value_1 = 0.0;
    }
    else {
      lVar20 = coda_ascii_parse_double(line_1 + 0x29,0xf,&double_value_1,0);
      lVar34 = local_9f0.offset;
      if (lVar20 < 0) goto LAB_00151529;
    }
    pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x178),(coda_dynamic_type *)0x0,
                                  local_9f0.product,double_value_1);
    coda_mem_record_add_field
              (local_9f0.epoch_record,"receiver_clock_offset",(coda_dynamic_type *)pcVar21,0);
    if (local_9f0.gps.sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar26 = coda_mem_array_new(local_9f0.gps.sat_obs_array_definition,(coda_dynamic_type *)0x0);
      local_9f0.gps.sat_obs_array._0_4_ = SUB84(pcVar26,0);
      local_9f0.gps.sat_obs_array._4_4_ = (undefined4)((ulong)pcVar26 >> 0x20);
    }
    if (local_9f0.glonass.sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar26 = coda_mem_array_new(local_9f0.glonass.sat_obs_array_definition,
                                   (coda_dynamic_type *)0x0);
      local_9f0.glonass.sat_obs_array._0_4_ = SUB84(pcVar26,0);
      local_9f0.glonass.sat_obs_array._4_4_ = (undefined4)((ulong)pcVar26 >> 0x20);
    }
    if (local_9f0.galileo.sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar26 = coda_mem_array_new(local_9f0.galileo.sat_obs_array_definition,
                                   (coda_dynamic_type *)0x0);
      local_9f0.galileo.sat_obs_array._0_4_ = SUB84(pcVar26,0);
      local_9f0.galileo.sat_obs_array._4_4_ = (undefined4)((ulong)pcVar26 >> 0x20);
    }
    if (local_9f0.sbas.sat_obs_array_definition != (coda_type_array *)0x0) {
      local_9f0.sbas.sat_obs_array =
           coda_mem_array_new(local_9f0.sbas.sat_obs_array_definition,(coda_dynamic_type *)0x0);
    }
    if (cVar9 == '0') {
      iVar18 = 0;
      while (iVar18 < local_88c) {
        local_880 = iVar18;
        local_9f0.offset = ftell((FILE *)local_9f0.f);
        local_9f0.linenumber = local_9f0.linenumber + 1;
        iVar18 = get_line(local_9f0.f,line);
        if (iVar18 < 0) goto LAB_0014f5f7;
        psVar35 = &local_9f0.galileo;
        if (((line[0] != 'E') && (psVar35 = &local_9f0.gps, line[0] != 'G')) &&
           ((psVar35 = &local_9f0.sbas, line[0] != 'S' &&
            (psVar35 = &local_9f0.glonass, line[0] != 'R')))) {
          pcVar31 = "invalid satellite system for epoch record (line: %ld, byte offset: %ld)";
          lVar34 = local_9f0.offset;
          goto LAB_00153b9f;
        }
        if (psVar35->sat_obs_array == (coda_mem_array *)0x0) {
          coda_set_error(-0x16,
                         "satellite system \'%c\' was not defined in header for this observation record (line: %ld, byte offset: %ld)"
                         ,(ulong)(byte)line[0],local_9f0.linenumber,local_9f0.offset);
          goto LAB_0014f5f7;
        }
        pcVar28 = psVar35->sat_obs_definition;
        if (pcVar28 == (coda_type_record *)0x0) {
          __assert_fail("sat_info->sat_obs_definition != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                        ,0x96e,"int read_observation_record_for_satellite(ingest_info *)");
        }
        pcVar31 = (char *)(long)iVar18;
        uVar33 = (long)psVar35->num_observables << 4;
        uVar30 = uVar33 | 3;
        if ((int)uVar33 < iVar18) {
          for (; (long)pcVar31 < (long)uVar30; pcVar31 = pcVar31 + 1) {
            line[(long)pcVar31] = ' ';
          }
        }
        else {
          uVar30 = uVar33 & 0xffffffff | 3;
        }
        if ((long)pcVar31 < (long)uVar30) {
          pcVar32 = "epoch line length (%ld) too short (line: %ld, byte offset: %ld)";
          lVar34 = local_9f0.offset;
          goto LAB_0014f5f0;
        }
        pcVar27 = coda_mem_record_new(pcVar28,(coda_dynamic_type *)0x0);
        uVar4 = str_1._0_8_;
        str_1[1] = line[2];
        str_1[0] = line[1];
        str_1._3_5_ = SUB85(uVar4,3);
        str_1[2] = '\0';
        iVar18 = __isoc99_sscanf(str_1,"%2d",&number);
        if (iVar18 != 1) goto LAB_00153b80;
        pcVar21 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x180),
                                     (coda_dynamic_type *)0x0,local_9f0.product,(uint8_t)number);
        coda_mem_record_add_field(pcVar27,"number",(coda_dynamic_type *)pcVar21,0);
        uVar30 = 0;
        local_818 = psVar35;
        local_830 = pcVar27;
        for (lVar34 = 0; lVar34 < psVar35->num_observables; lVar34 = lVar34 + 1) {
          local_810 = lVar34;
          str_1._0_8_ = *(undefined8 *)(line + uVar30 + 3);
          uVar4 = *(undefined8 *)(line + uVar30 + 0xb);
          str_1[0xe] = (char)((ulong)uVar4 >> 0x30);
          str_1[0xf] = (char)((ulong)uVar4 >> 0x38);
          value = str_1[0xe] - 0x30;
          if (9 < value) {
            value = 0;
          }
          value_00 = str_1[0xf] - 0x30;
          if (9 < value_00) {
            value_00 = 0;
          }
          str_1._8_6_ = (undefined6)uVar4;
          str_1[0xe] = '\0';
          iVar18 = __isoc99_sscanf(str_1,"%lf",&local_820);
          if (iVar18 != 1) {
            iVar18 = bcmp(str_1,"              ",0xf);
            if (iVar18 != 0) {
              coda_dynamic_type_delete((coda_dynamic_type *)local_830);
              pcVar31 = "invalid observation value (line: %ld, byte offset: %ld)";
              lVar34 = (uVar30 & 0xffffffff) + local_9f0.offset + 3;
              goto LAB_00153b9f;
            }
            local_820 = 0.0;
          }
          type = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x1a0),
                                     (coda_dynamic_type *)0x0);
          pcVar21 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x188),
                                        (coda_dynamic_type *)0x0,local_9f0.product,local_820);
          coda_mem_record_add_field(type,"observation",(coda_dynamic_type *)pcVar21,0);
          pcVar21 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 400),
                                       (coda_dynamic_type *)0x0,local_9f0.product,value);
          coda_mem_record_add_field(type,"lli",(coda_dynamic_type *)pcVar21,0);
          pcVar21 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x198),
                                       (coda_dynamic_type *)0x0,local_9f0.product,value_00);
          coda_mem_record_add_field(type,"signal_strength",(coda_dynamic_type *)pcVar21,0);
          lVar34 = local_810;
          psVar35 = local_818;
          pcVar27 = local_830;
          coda_mem_record_add_field
                    (local_830,local_818->observable[local_810],(coda_dynamic_type *)type,0);
          uVar30 = uVar30 + 0x10;
        }
        coda_mem_array_add_element(psVar35->sat_obs_array,(coda_dynamic_type *)pcVar27);
        iVar18 = local_880 + 1;
      }
    }
    else {
      iVar18 = -1;
      while (iVar18 = iVar18 + 1, iVar18 < local_88c) {
        local_9f0.offset = ftell((FILE *)local_9f0.f);
        local_9f0.linenumber = local_9f0.linenumber + 1;
        iVar19 = get_line(local_9f0.f,line_1);
        if (iVar19 < 0) goto LAB_0014f5f7;
      }
    }
    if ((coda_dynamic_type *)
        CONCAT44(local_9f0.gps.sat_obs_array._4_4_,local_9f0.gps.sat_obs_array._0_4_) !=
        (coda_dynamic_type *)0x0) {
      coda_mem_record_add_field
                (local_9f0.epoch_record,"gps",
                 (coda_dynamic_type *)
                 CONCAT44(local_9f0.gps.sat_obs_array._4_4_,local_9f0.gps.sat_obs_array._0_4_),0);
      local_9f0.gps.sat_obs_array._0_4_ = 0;
      local_9f0.gps.sat_obs_array._4_4_ = 0;
    }
    if ((coda_dynamic_type *)
        CONCAT44(local_9f0.glonass.sat_obs_array._4_4_,local_9f0.glonass.sat_obs_array._0_4_) !=
        (coda_dynamic_type *)0x0) {
      coda_mem_record_add_field
                (local_9f0.epoch_record,"glonass",
                 (coda_dynamic_type *)
                 CONCAT44(local_9f0.glonass.sat_obs_array._4_4_,
                          local_9f0.glonass.sat_obs_array._0_4_),0);
      local_9f0.glonass.sat_obs_array._0_4_ = 0;
      local_9f0.glonass.sat_obs_array._4_4_ = 0;
    }
    if ((coda_dynamic_type *)
        CONCAT44(local_9f0.galileo.sat_obs_array._4_4_,local_9f0.galileo.sat_obs_array._0_4_) !=
        (coda_dynamic_type *)0x0) {
      coda_mem_record_add_field
                (local_9f0.epoch_record,"galileo",
                 (coda_dynamic_type *)
                 CONCAT44(local_9f0.galileo.sat_obs_array._4_4_,
                          local_9f0.galileo.sat_obs_array._0_4_),0);
      local_9f0.galileo.sat_obs_array._0_4_ = 0;
      local_9f0.galileo.sat_obs_array._4_4_ = 0;
    }
    if (local_9f0.sbas.sat_obs_array != (coda_mem_array *)0x0) {
      coda_mem_record_add_field
                (local_9f0.epoch_record,"sbas",(coda_dynamic_type *)local_9f0.sbas.sat_obs_array,0);
      local_9f0.sbas.sat_obs_array = (coda_mem_array *)0x0;
    }
    coda_mem_array_add_element(local_9f0.records,(coda_dynamic_type *)local_9f0.epoch_record);
    local_9f0.epoch_record = (coda_mem_record *)0x0;
    local_9f0.offset = ftell((FILE *)local_9f0.f);
    local_9f0.linenumber = local_9f0.linenumber + 1;
    uVar17 = get_line(local_9f0.f,line_1);
    if ((int)uVar17 < 0) break;
LAB_001533ac:
    if (uVar17 == 0) {
LAB_00153a6e:
      pcVar28 = coda_type_record_new(coda_format_rinex);
      pcVar27 = coda_mem_record_new(pcVar28,(coda_dynamic_type *)0x0);
      coda_type_release((coda_type *)pcVar28);
      iVar18 = 1;
      coda_mem_record_add_field(pcVar27,"header",(coda_dynamic_type *)local_9f0.header,1);
      local_9f0.header = (coda_mem_record *)0x0;
      pcVar31 = "record";
      pcVar26 = local_9f0.records;
LAB_00153ac1:
      coda_mem_record_add_field(pcVar27,pcVar31,(coda_dynamic_type *)pcVar26,iVar18);
      *local_888 = (coda_mem_array *)0x0;
      product->root_type = (coda_dynamic_type *)pcVar27;
      ingest_info_cleanup(&local_9f0);
      return 0;
    }
    if (uVar17 < 0x23) {
      pcVar31 = (char *)(ulong)uVar17;
      goto LAB_00153ae9;
    }
  }
LAB_0014f5f7:
  ingest_info_cleanup(&local_9f0);
  return -1;
}

Assistant:

static int read_file(coda_product *product)
{
    coda_mem_record *root_type = NULL;
    ingest_info info;

    ingest_info_init(&info);
    info.product = product;

    info.f = fopen(product->filename, "r");
    if (info.f == NULL)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s", product->filename);
        return -1;
    }

    info.header = coda_mem_record_new((coda_type_record *)sp3_type[sp3_header], NULL);
    info.records = coda_mem_array_new((coda_type_array *)sp3_type[sp3_records], NULL);

    if (read_header(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    if (read_records(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    /* create root record */
    root_type = coda_mem_record_new((coda_type_record *)sp3_type[sp3_file], NULL);
    coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 0);
    info.header = NULL;
    coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 0);
    info.records = NULL;

    product->root_type = (coda_dynamic_type *)root_type;

    ingest_info_cleanup(&info);

    return 0;
}